

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O3

void testutil_random_ge_test(secp256k1_ge *ge)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  secp256k1_fe fe;
  secp256k1_fe local_40;
  
  do {
    testutil_random_fe_test(&local_40);
    lVar3 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
            secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
    uVar4 = secp256k1_test_state[1] << 0x11;
    uVar5 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
    uVar2 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
    secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar5;
    secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar2;
    secp256k1_test_state[2] = uVar5 ^ uVar4;
    secp256k1_test_state[3] = uVar2 << 0x2d | uVar2 >> 0x13;
    iVar1 = secp256k1_ge_set_xo_var(ge,&local_40,(uint)((ulong)lVar3 >> 0x3f));
  } while (iVar1 == 0);
  secp256k1_fe_normalize(&ge->y);
  ge->infinity = 0;
  return;
}

Assistant:

static void testutil_random_ge_test(secp256k1_ge *ge) {
    secp256k1_fe fe;
    do {
        testutil_random_fe_test(&fe);
        if (secp256k1_ge_set_xo_var(ge, &fe, testrand_bits(1))) {
            secp256k1_fe_normalize(&ge->y);
            break;
        }
    } while(1);
    ge->infinity = 0;
}